

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_reset(Parser *this)

{
  code *pcVar1;
  Location loc;
  bool bVar2;
  error_flags eVar3;
  size_t sVar4;
  ParserOptions *in_RDI;
  char msg [36];
  size_t in_stack_fffffffffffffe88;
  State *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  Location *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  Location *in_stack_fffffffffffffeb0;
  State *this_00;
  char (*in_stack_fffffffffffffee0) [25];
  State *in_stack_fffffffffffffee8;
  stack<c4::yml::Parser::State,_16UL> *in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef8 [32];
  Parser *in_stack_ffffffffffffff60;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  char *local_70;
  undefined1 local_68 [80];
  Location *pLStack_18;
  char *local_10;
  ParserOptions *local_8;
  
  sVar4 = detail::stack<c4::yml::Parser::State,_16UL>::size
                    ((stack<c4::yml::Parser::State,_16UL> *)(in_RDI + 0xe));
  if (sVar4 != 1) {
    memcpy(local_68,"check failed: (m_stack.size() == 1)",0x24);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x27a);
    Location::Location(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                       (size_t)in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98,
                       (size_t)in_stack_fffffffffffffe90);
    in_stack_fffffffffffffe98 = (char *)CONCAT44(uStack_7c,local_80);
    in_stack_fffffffffffffea0 = (Location *)CONCAT44(uStack_74,uStack_78);
    in_stack_fffffffffffffe88 = CONCAT44(uStack_8c,local_90);
    in_stack_fffffffffffffe90 = (State *)CONCAT44(uStack_84,uStack_88);
    (*pcVar1)(local_68,0x24,*(undefined8 *)(in_RDI + 0x274));
    in_stack_fffffffffffffea8 = local_70;
  }
  detail::stack<c4::yml::Parser::State,_16UL>::clear
            ((stack<c4::yml::Parser::State,_16UL> *)(in_RDI + 0xe));
  this_00 = (State *)(in_RDI + 0xe);
  State::State(in_stack_fffffffffffffe90);
  detail::stack<c4::yml::Parser::State,_16UL>::push
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_8 = in_RDI + 0xe;
  if (*(long *)(in_RDI + 0x270) == 0) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                       (size_t)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    loc.super_LineCol.line = in_stack_fffffffffffffef8._0_8_;
    loc.super_LineCol.col = in_stack_fffffffffffffef8._8_8_;
    loc.name.str = (char *)SUB168(in_stack_fffffffffffffef8._16_16_,0);
    loc.name.len = SUB168(in_stack_fffffffffffffef8._16_16_,8);
    loc.super_LineCol.offset = (size_t)in_stack_fffffffffffffef0;
    error<25ul>(in_stack_fffffffffffffee0,loc);
    in_stack_fffffffffffffea0 = pLStack_18;
    in_stack_fffffffffffffea8 = local_10;
  }
  *(long *)(in_RDI + 0x27c) = *(long *)(in_RDI + 0x26e) + (*(long *)(in_RDI + 0x270) + -1) * 0x98;
  State::reset(this_00,in_stack_fffffffffffffea8,(size_t)in_stack_fffffffffffffea0);
  *(undefined8 *)(in_RDI + 0x27e) = 0;
  *(undefined8 *)(in_RDI + 0x280) = 0;
  basic_substring<const_char>::clear((basic_substring<const_char> *)(in_RDI + 0x282));
  basic_substring<const_char>::clear((basic_substring<const_char> *)(in_RDI + 0x286));
  *(undefined8 *)(in_RDI + 0x28a) = 0;
  basic_substring<const_char>::clear((basic_substring<const_char> *)(in_RDI + 0x28c));
  *(undefined1 *)&in_RDI[0x290].flags = 0;
  *(undefined8 *)(in_RDI + 0x292) = 0;
  basic_substring<const_char>::clear((basic_substring<const_char> *)(in_RDI + 0x294));
  *(undefined8 *)(in_RDI + 0x298) = 0;
  basic_substring<const_char>::clear((basic_substring<const_char> *)(in_RDI + 0x29a));
  bVar2 = ParserOptions::locations(in_RDI);
  if (bVar2) {
    _prepare_locations(in_stack_ffffffffffffff60);
  }
  return;
}

Assistant:

void Parser::_reset()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_stack.size() == 1);
    m_stack.clear();
    m_stack.push({});
    m_state = &m_stack.top();
    m_state->reset(m_file.str, m_root_id);

    m_key_tag_indentation = 0;
    m_key_tag2_indentation = 0;
    m_key_tag.clear();
    m_key_tag2.clear();
    m_val_tag_indentation = 0;
    m_val_tag.clear();
    m_key_anchor_was_before = false;
    m_key_anchor_indentation = 0;
    m_key_anchor.clear();
    m_val_anchor_indentation = 0;
    m_val_anchor.clear();

    if(m_options.locations())
    {
        _prepare_locations();
    }
}